

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_21::bufferedReadPixels(Data *ifd,int scanLine1,int scanLine2)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  ArgExc *this;
  Slice *pSVar6;
  long in_RDI;
  int i;
  int x;
  int y;
  int yStart_1;
  int xStart;
  int size;
  char *toPtr;
  char *fromPtr;
  Slice toSlice;
  Slice fromSlice;
  ConstIterator k;
  int maxYThisRow;
  int minYThisRow;
  Box2i tileRange;
  int j;
  Box2i levelRange;
  int yStep;
  int yEnd;
  int yStart;
  int maxDy;
  int minDy;
  int maxY;
  int minY;
  char *in_stack_00000178;
  FrameBuffer *in_stack_00000180;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  ConstIterator *in_stack_fffffffffffffec0;
  TiledInputFile *in_stack_fffffffffffffec8;
  TiledInputFile *in_stack_fffffffffffffed0;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  _Base_ptr *local_f8;
  long local_f0;
  undefined1 local_e8 [8];
  ConstIterator *local_e0;
  long local_d8;
  long local_d0;
  int local_c8;
  int local_c4;
  undefined1 local_b0 [8];
  long local_a8;
  long local_a0;
  long local_98;
  iterator local_78;
  iterator local_68;
  int local_58;
  int local_54;
  int local_4c [2];
  int iStack_44;
  uint local_40;
  int local_3c;
  int local_34;
  int local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = in_RDI;
  piVar5 = std::min<int>(&local_c,&local_10);
  local_14 = *piVar5;
  piVar5 = std::max<int>(&local_c,&local_10);
  local_18 = *piVar5;
  if ((*(int *)(local_8 + 0x84) <= local_14) && (local_18 <= *(int *)(local_8 + 0x88))) {
    uVar2 = local_14 - *(int *)(local_8 + 0x84);
    local_1c = TiledInputFile::tileYSize(*(TiledInputFile **)(local_8 + 0x68));
    local_1c = uVar2 / local_1c;
    uVar2 = local_18 - *(int *)(local_8 + 0x84);
    local_20 = TiledInputFile::tileYSize(*(TiledInputFile **)(local_8 + 0x68));
    local_20 = uVar2 / local_20;
    if (*(int *)(local_8 + 0x80) == 1) {
      local_28 = local_1c - 1;
      local_2c = -1;
      local_24 = local_20;
    }
    else {
      local_24 = local_1c;
      local_28 = local_20 + 1;
      local_2c = 1;
    }
    TiledInputFile::dataWindowForLevel
              (in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
    for (local_40 = local_24; local_40 != local_28; local_40 = local_2c + local_40) {
      TiledInputFile::dataWindowForTile
                (in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                 (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
      piVar5 = std::max<int>(&local_14,local_4c);
      local_54 = *piVar5;
      piVar5 = std::min<int>(&local_18,&iStack_44);
      local_58 = *piVar5;
      if (local_40 != *(uint *)(local_8 + 0xd0)) {
        TiledInputFile::numXTiles((TiledInputFile *)toSlice._32_8_,toSlice.yStride._4_4_);
        TiledInputFile::readTiles
                  (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (int)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                   (int)in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        *(uint *)(local_8 + 0xd0) = local_40;
      }
      local_68._M_node =
           (_Base_ptr)
           FrameBuffer::begin((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      FrameBuffer::ConstIterator::ConstIterator
                (in_stack_fffffffffffffec0,
                 (Iterator *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      while( true ) {
        local_78._M_node =
             (_Base_ptr)
             FrameBuffer::end((FrameBuffer *)
                              CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        FrameBuffer::ConstIterator::ConstIterator
                  (in_stack_fffffffffffffec0,
                   (Iterator *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        bVar1 = Imf_2_5::operator!=(in_stack_fffffffffffffec0,
                                    (ConstIterator *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        if (!bVar1) break;
        pSVar6 = FrameBuffer::ConstIterator::slice((ConstIterator *)0x237d66);
        memcpy(local_b0,pSVar6,0x38);
        in_stack_fffffffffffffed0 = (TiledInputFile *)(local_8 + 0x90);
        FrameBuffer::ConstIterator::name((ConstIterator *)0x237d9b);
        pSVar6 = FrameBuffer::operator[](in_stack_00000180,in_stack_00000178);
        memcpy(local_e8,pSVar6,0x38);
        iVar3 = pixelTypeSize((PixelType)((ulong)in_stack_fffffffffffffec0 >> 0x20));
        local_100 = local_3c;
        local_104 = local_54;
        while (iVar4 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                       (int)in_stack_fffffffffffffec0), iVar4 != 0) {
          local_100 = local_100 + 1;
        }
        while (iVar4 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffec0 >> 0x20),
                                       (int)in_stack_fffffffffffffec0), iVar4 != 0) {
          local_104 = local_104 + 1;
        }
        for (local_108 = local_104; local_108 <= local_58; local_108 = local_c4 + local_108) {
          local_f0 = local_a8 + (local_108 - local_4c[0]) * local_98 + local_100 * local_a0;
          in_stack_fffffffffffffec0 = local_e0;
          iVar4 = Imath_2_5::divp(local_108,local_c4);
          in_stack_fffffffffffffec8 =
               (TiledInputFile *)((long)&(in_stack_fffffffffffffec0->_i)._M_node + iVar4 * local_d0)
          ;
          iVar4 = Imath_2_5::divp(local_100,local_c8);
          local_f8 = (_Base_ptr *)
                     ((long)&(in_stack_fffffffffffffec8->super_GenericInputFile).
                             _vptr_GenericInputFile + iVar4 * local_d8);
          for (local_10c = local_100; local_10c <= local_34; local_10c = local_c8 + local_10c) {
            for (local_110 = 0; local_110 < iVar3; local_110 = local_110 + 1) {
              *(undefined1 *)((long)local_f8 + (long)local_110) =
                   *(undefined1 *)(local_f0 + local_110);
            }
            local_f0 = local_a0 * local_c8 + local_f0;
            local_f8 = (_Base_ptr *)((long)local_f8 + local_d8);
          }
        }
        FrameBuffer::ConstIterator::operator++(in_stack_fffffffffffffec0);
      }
    }
    return;
  }
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this,"Tried to read scan line outside the image file\'s data window.");
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
bufferedReadPixels (InputFile::Data* ifd, int scanLine1, int scanLine2)
{
    //
    // bufferedReadPixels reads each row of tiles that intersect the
    // scan-line range (scanLine1 to scanLine2). The previous row of
    // tiles is cached in order to prevent redundent tile reads when
    // accessing scanlines sequentially.
    //

    int minY = std::min (scanLine1, scanLine2);
    int maxY = std::max (scanLine1, scanLine2);

    if (minY < ifd->minY || maxY >  ifd->maxY)
    {
        throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			   "the image file's data window.");
    }

    //
    // The minimum and maximum y tile coordinates that intersect this
    // scanline range
    //

    int minDy = (minY - ifd->minY) / ifd->tFile->tileYSize();
    int maxDy = (maxY - ifd->minY) / ifd->tFile->tileYSize();

    //
    // Figure out which one is first in the file so we can read without seeking
    //

    int yStart, yEnd, yStep;

    if (ifd->lineOrder == DECREASING_Y)
    {
        yStart = maxDy;
        yEnd = minDy - 1;
        yStep = -1;
    }
    else
    {
        yStart = minDy;
        yEnd = maxDy + 1;
        yStep = 1;
    }

    //
    // the number of pixels in a row of tiles
    //

    Box2i levelRange = ifd->tFile->dataWindowForLevel(0);
    
    //
    // Read the tiles into our temporary framebuffer and copy them into
    // the user's buffer
    //

    for (int j = yStart; j != yEnd; j += yStep)
    {
        Box2i tileRange = ifd->tFile->dataWindowForTile (0, j, 0);

        int minYThisRow = std::max (minY, tileRange.min.y);
        int maxYThisRow = std::min (maxY, tileRange.max.y);

        if (j != ifd->cachedTileY)
        {
            //
            // We don't have any valid buffered info, so we need to read in
            // from the file.
            //

            ifd->tFile->readTiles (0, ifd->tFile->numXTiles (0) - 1, j, j);
            ifd->cachedTileY = j;
        }

        //
        // Copy the data from our cached framebuffer into the user's
        // framebuffer.
        //

        for (FrameBuffer::ConstIterator k = ifd->cachedBuffer->begin();
             k != ifd->cachedBuffer->end();
             ++k)
        {
            Slice fromSlice = k.slice();		// slice to write from
            Slice toSlice = ifd->tFileBuffer[k.name()];	// slice to write to

            char *fromPtr, *toPtr;
            int size = pixelTypeSize (toSlice.type);

	    int xStart = levelRange.min.x;
	    int yStart = minYThisRow;

	    while (modp (xStart, toSlice.xSampling) != 0)
		++xStart;

	    while (modp (yStart, toSlice.ySampling) != 0)
		++yStart;

            for (int y = yStart;
		 y <= maxYThisRow;
		 y += toSlice.ySampling)
            {
		//
                // Set the pointers to the start of the y scanline in
                // this row of tiles
		//
                
                fromPtr = fromSlice.base +
                          (y - tileRange.min.y) * fromSlice.yStride +
                          xStart * fromSlice.xStride;

                toPtr = toSlice.base +
                        divp (y, toSlice.ySampling) * toSlice.yStride +
                        divp (xStart, toSlice.xSampling) * toSlice.xStride;

		//
                // Copy all pixels for the scanline in this row of tiles
		//

                for (int x = xStart;
		     x <= levelRange.max.x;
		     x += toSlice.xSampling)
                {
		    for (int i = 0; i < size; ++i)
			toPtr[i] = fromPtr[i];

		    fromPtr += fromSlice.xStride * toSlice.xSampling;
		    toPtr += toSlice.xStride;
                }
            }
        }
    }
}